

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

Clause * __thiscall Inferences::CompositeISE::simplify(CompositeISE *this,Clause *cl)

{
  ISList *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  ISList **ppIVar4;
  Clause *pCVar3;
  
  if (cl == (Clause *)0x0) {
    pCVar3 = (Clause *)0x0;
  }
  else {
    ppIVar4 = &this->_inners;
    do {
      pIVar1 = *ppIVar4;
      if (pIVar1 == (ISList *)0x0) {
        return cl;
      }
      iVar2 = (*(pIVar1->_head->super_InferenceEngine)._vptr_InferenceEngine[6])(pIVar1->_head,cl);
      pCVar3 = (Clause *)CONCAT44(extraout_var,iVar2);
      ppIVar4 = &pIVar1->_tail;
    } while (pCVar3 == cl);
  }
  return pCVar3;
}

Assistant:

Clause* CompositeISE::simplify(Clause* cl)
{
  ISList* curr=_inners;
  while(curr && cl) {
    Clause* newCl=curr->head()->simplify(cl);
    if(newCl==cl) {
      curr=curr->tail();
    } else {
      return newCl;
    }
  }
  return cl;
}